

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model_set.c
# Opt level: O1

int my_compare(void *a,void *b)

{
  char *__s1;
  char *__s1_00;
  int iVar1;
  
  __s1 = *a;
  iVar1 = strcmp(__s1,"<UNK>");
  if (iVar1 == 0) {
    iVar1 = -1;
  }
  else {
    __s1_00 = *b;
    iVar1 = strcmp(__s1_00,"<UNK>");
    if (iVar1 != 0) {
      iVar1 = strcmp(__s1,__s1_00);
      return iVar1;
    }
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int
my_compare(const void *a, const void *b)
{
    /* Make sure <UNK> floats to the beginning. */
    if (strcmp(*(char *const *) a, "<UNK>") == 0)
        return -1;
    else if (strcmp(*(char *const *) b, "<UNK>") == 0)
        return 1;
    else
        return strcmp(*(char *const *) a, *(char *const *) b);
}